

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlSavePattern(Fra_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  sat_solver *psVar4;
  Aig_Man_t *pAVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  pAVar5 = p->pManFraig;
  pVVar2 = pAVar5->vCis;
  iVar8 = pVVar2->nSize;
  if (0 < iVar8) {
    ppvVar3 = pVVar2->pArray;
    psVar4 = p->pSat;
    uVar6 = 0;
    do {
      iVar1 = *(int *)(*(long *)(*(long *)((long)ppvVar3[uVar6] + 0x28) + 0x98) +
                      (long)*(int *)((long)ppvVar3[uVar6] + 0x24) * 4);
      if (((long)iVar1 < 0) || (psVar4->size <= iVar1)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (psVar4->model[iVar1] == 1) {
        p->pPatWords[uVar6 >> 5 & 0x7ffffff] =
             p->pPatWords[uVar6 >> 5 & 0x7ffffff] | 1 << ((byte)uVar6 & 0x1f);
        iVar8 = pVVar2->nSize;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar8);
  }
  if (p->vCex != (Vec_Int_t *)0x0) {
    p->vCex->nSize = 0;
    if (p->pManAig->nRegs < p->pManAig->nObjs[2]) {
      uVar7 = 0;
      do {
        Vec_IntPush(p->vCex,(uint)((p->pPatWords[uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0));
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < p->pManAig->nObjs[2] - p->pManAig->nRegs);
      pAVar5 = p->pManFraig;
    }
    if (0 < pAVar5->nRegs) {
      uVar7 = pAVar5->nObjs[2] - pAVar5->nRegs;
      do {
        Vec_IntPush(p->vCex,(uint)((p->pPatWords[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0));
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < p->pManFraig->nObjs[2]);
    }
  }
  return;
}

Assistant:

void Fra_SmlSavePattern( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
//        if ( p->pSat->model.ptr[Fra_ObjSatNum(pObj)] == l_True )
        if ( sat_solver_var_value(p->pSat, Fra_ObjSatNum(pObj)) )
            Abc_InfoSetBit( p->pPatWords, i );

    if ( p->vCex )
    {
        Vec_IntClear( p->vCex );
        for ( i = 0; i < Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
        for ( i = Aig_ManCiNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig); i < Aig_ManCiNum(p->pManFraig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
    }

/*
    printf( "Pattern: " );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
        printf( "%d", Abc_InfoHasBit( p->pPatWords, i ) );
    printf( "\n" );
*/
}